

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/Spindlyskit[P]ccipher/test/ccipher.t.c"
            );
  UnityDefaultTestRun(test_get_ngram_index,"test_get_ngram_index",0x170);
  UnityDefaultTestRun(test_load_quadgrams,"test_load_quadgrams",0x171);
  UnityDefaultTestRun(test_scorer_quadgram_score,"test_scorer_quadgram_score",0x172);
  UnityDefaultTestRun(test_string_case_change,"test_string_case_change",0x173);
  UnityDefaultTestRun(test_string_schema,"test_string_schema",0x174);
  UnityDefaultTestRun(test_cipher_caesar_with_data,"test_cipher_caesar_with_data",0x175);
  UnityDefaultTestRun(test_cipher_caesar_parse_key,"test_cipher_caesar_parse_key",0x176);
  UnityDefaultTestRun(test_cipher_caesar_solve,"test_cipher_caesar_solve",0x177);
  UnityDefaultTestRun(test_cipher_caesar_crack,"test_cipher_caesar_crack",0x178);
  UnityDefaultTestRun(test_cipher_substitution_with_data,"test_cipher_substitution_with_data",0x179)
  ;
  UnityDefaultTestRun(test_cipher_substitution_parse_key,"test_cipher_substitution_parse_key",0x17a)
  ;
  UnityDefaultTestRun(test_cipher_substitution_solve,"test_cipher_substitution_solve",0x17b);
  UnityDefaultTestRun(test_cipher_substitution_crack,"test_cipher_substitution_crack",0x17c);
  UnityDefaultTestRun(test_cipher_vigenere_solve,"test_cipher_vigenere_solve",0x17d);
  UnityDefaultTestRun(test_cipher_vigenere_crack,"test_cipher_vigenere_crack",0x17e);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_get_ngram_index);
	RUN_TEST(test_load_quadgrams);
	RUN_TEST(test_scorer_quadgram_score);
	RUN_TEST(test_string_case_change);
	RUN_TEST(test_string_schema);
	RUN_TEST(test_cipher_caesar_with_data);
	RUN_TEST(test_cipher_caesar_parse_key);
	RUN_TEST(test_cipher_caesar_solve);
	RUN_TEST(test_cipher_caesar_crack);
	RUN_TEST(test_cipher_substitution_with_data);
	RUN_TEST(test_cipher_substitution_parse_key);
	RUN_TEST(test_cipher_substitution_solve);
	RUN_TEST(test_cipher_substitution_crack);
	RUN_TEST(test_cipher_vigenere_solve);
	RUN_TEST(test_cipher_vigenere_crack);
	return UNITY_END();
}